

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.cxx
# Opt level: O0

bool cmGetFilenameComponentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string_view sVar1;
  cmExecutionStatus *this_00;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  const_reference pvVar5;
  long lVar6;
  cmMakefile *pcVar7;
  string *psVar8;
  const_reference __lhs;
  ulong uVar9;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  undefined4 local_334;
  undefined1 local_330 [8];
  string err;
  string local_2f0;
  uint local_2cc;
  undefined1 local_2c8 [4];
  uint i_1;
  string baseDir;
  string local_288;
  string local_268;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_208;
  undefined1 local_1e8 [8];
  string program;
  string local_1b0;
  string_view local_190;
  string local_180;
  uint local_15c;
  undefined1 local_158 [4];
  uint i;
  string local_138;
  undefined1 local_118 [8];
  string programArgs;
  string storeArgs;
  string other;
  KeyWOW64 other_view;
  KeyWOW64 view;
  string filename;
  string result;
  cmValue local_60;
  cmValue cacheValue;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this_00 = local_20;
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 0;
    goto LAB_007fb9b0;
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
  if (3 < sVar4) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    bVar2 = std::operator==(pvVar5,"CACHE");
    if (bVar2) {
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
      local_60 = cmMakefile::GetDefinition(pcVar7,pvVar5);
      bVar2 = cmValue::operator_cast_to_bool(&local_60);
      if (bVar2) {
        psVar8 = cmValue::operator*[abi_cxx11_(&local_60);
        sVar1 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
        bVar2 = cmIsNOTFOUND(sVar1);
        if (!bVar2) {
          args_local._7_1_ = 1;
          goto LAB_007fb9b0;
        }
      }
    }
  }
  std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8));
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
  std::__cxx11::string::string((string *)&other_view,(string *)pvVar5);
  lVar6 = std::__cxx11::string::find((char *)&other_view,0x125e494);
  if (lVar6 != -1) {
    other.field_2._12_4_ = 1;
    other.field_2._8_4_ = 2;
    pcVar7 = cmExecutionStatus::GetMakefile(local_20);
    bVar2 = cmMakefile::PlatformIs64Bit(pcVar7);
    if (bVar2) {
      other.field_2._12_4_ = 2;
      other.field_2._8_4_ = 1;
    }
    cmSystemTools::ExpandRegistryValues((string *)&other_view,other.field_2._12_4_);
    lVar6 = std::__cxx11::string::find((char *)&other_view,0x1247aa1);
    if (lVar6 != -1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      std::__cxx11::string::string((string *)(storeArgs.field_2._M_local_buf + 8),(string *)pvVar5);
      cmSystemTools::ExpandRegistryValues
                ((string *)((long)&storeArgs.field_2 + 8),other.field_2._8_4_);
      lVar6 = std::__cxx11::string::find(storeArgs.field_2._M_local_buf + 8,0x1247aa1);
      if (lVar6 == -1) {
        std::__cxx11::string::operator=
                  ((string *)&other_view,(string *)(storeArgs.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)(storeArgs.field_2._M_local_buf + 8));
    }
  }
  std::__cxx11::string::string((string *)(programArgs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_118);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,2);
  bVar2 = std::operator==(pvVar5,"DIRECTORY");
  if (bVar2) {
LAB_007fad69:
    cmsys::SystemTools::GetFilenamePath(&local_138,(string *)&other_view);
    std::__cxx11::string::operator=
              ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
LAB_007fb611:
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (sVar4 < 4) {
LAB_007fb86c:
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          pcVar7 = cmExecutionStatus::GetMakefile(local_20);
          sVar1 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_118);
          cmMakefile::AddDefinition(pcVar7,(string *)((long)&programArgs.field_2 + 8),sVar1);
        }
      }
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(filename.field_2._M_local_buf + 8));
      cmMakefile::AddDefinition(pcVar7,pvVar5,sVar1);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
      bVar2 = std::operator==(pvVar5,"CACHE");
      if (!bVar2) goto LAB_007fb86c;
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          pcVar7 = cmExecutionStatus::GetMakefile(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"",&local_359);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,2);
          bVar2 = std::operator==(pvVar5,"PATH");
          cmMakefile::AddCacheDefinition
                    (pcVar7,(string *)((long)&programArgs.field_2 + 8),(string *)local_118,
                     &local_358,bVar2 ^ STRING,false);
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator(&local_359);
        }
      }
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"",&local_381);
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,2);
      bVar2 = std::operator==(__lhs,"PATH");
      cmMakefile::AddCacheDefinition
                (pcVar7,pvVar5,(string *)((long)&filename.field_2 + 8),&local_380,bVar2 ^ STRING,
                 false);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator(&local_381);
    }
    args_local._7_1_ = 1;
    local_334 = 1;
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"PATH");
    if (bVar2) goto LAB_007fad69;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"NAME");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameName((string *)local_158,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)local_158);
      std::__cxx11::string::~string((string *)local_158);
      goto LAB_007fb611;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"PROGRAM");
    if (bVar2) {
      for (local_15c = 2; uVar9 = (ulong)local_15c,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local), uVar9 < sVar4; local_15c = local_15c + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_15c);
        bVar2 = std::operator==(pvVar5,"PROGRAM_ARGS");
        if (bVar2) {
          local_15c = local_15c + 1;
          uVar9 = (ulong)local_15c;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
          if (uVar9 < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(ulong)local_15c);
            std::__cxx11::string::operator=
                      ((string *)(programArgs.field_2._M_local_buf + 8),(string *)pvVar5);
          }
        }
      }
      local_190 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&other_view);
      cmTrimWhitespace_abi_cxx11_(&local_180,local_190);
      bVar3 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_180);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        program.field_2._8_8_ = 0;
        this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&program.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this);
        cmsys::SystemTools::FindProgram(&local_1b0,(string *)&other_view,this,false);
        std::__cxx11::string::operator=
                  ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&program.field_2 + 8));
      }
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) != 0) {
        std::__cxx11::string::string((string *)local_1e8);
        bVar2 = cmSystemTools::SplitProgramFromArgs
                          ((string *)&other_view,(string *)local_1e8,(string *)local_118);
        if (bVar2) {
          bVar2 = cmsys::SystemTools::FileExists((string *)local_1e8);
          if (bVar2) {
            std::__cxx11::string::operator=
                      ((string *)(filename.field_2._M_local_buf + 8),(string *)local_1e8);
          }
          else {
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_228);
            cmsys::SystemTools::FindProgram(&local_208,(string *)local_1e8,&local_228,false);
            std::__cxx11::string::operator=
                      ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_228);
          }
        }
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) != 0) {
          std::__cxx11::string::clear();
        }
        std::__cxx11::string::~string((string *)local_1e8);
      }
      goto LAB_007fb611;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"EXT");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameExtension(&local_248,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      goto LAB_007fb611;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"NAME_WE");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_268,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      goto LAB_007fb611;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"LAST_EXT");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameLastExtension(&local_288,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      goto LAB_007fb611;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"NAME_WLE");
    if (bVar2) {
      cmsys::SystemTools::GetFilenameWithoutLastExtension
                ((string *)((long)&baseDir.field_2 + 8),(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),
                 (string *)(baseDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(baseDir.field_2._M_local_buf + 8));
      goto LAB_007fb611;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"ABSOLUTE");
    if (bVar2) {
LAB_007fb39f:
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar7);
      std::__cxx11::string::string((string *)local_2c8,(string *)psVar8);
      for (local_2cc = 3; uVar9 = (ulong)local_2cc,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local), uVar9 < sVar4; local_2cc = local_2cc + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_2cc);
        bVar2 = std::operator==(pvVar5,"BASE_DIR");
        if (bVar2) {
          local_2cc = local_2cc + 1;
          uVar9 = (ulong)local_2cc;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
          if (uVar9 < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(ulong)local_2cc);
            std::__cxx11::string::operator=((string *)local_2c8,(string *)pvVar5);
          }
        }
      }
      cmsys::SystemTools::CollapseFullPath(&local_2f0,(string *)&other_view,(string *)local_2c8);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      bVar2 = std::operator==(pvVar5,"REALPATH");
      if (bVar2) {
        cmsys::SystemTools::GetRealPath
                  ((string *)((long)&err.field_2 + 8),(string *)((long)&filename.field_2 + 8),
                   (string *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(filename.field_2._M_local_buf + 8),
                   (string *)(err.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_2c8);
      goto LAB_007fb611;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    bVar2 = std::operator==(pvVar5,"REALPATH");
    if (bVar2) goto LAB_007fb39f;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   "unknown component ",pvVar5);
    cmExecutionStatus::SetError(local_20,(string *)local_330);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 0;
    local_334 = 1;
    std::__cxx11::string::~string((string *)local_330);
  }
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)(programArgs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&other_view);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
LAB_007fb9b0:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmGetFilenameComponentCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Check and see if the value has been stored in the cache
  // already, if so use that value
  if (args.size() >= 4 && args.back() == "CACHE") {
    cmValue cacheValue = status.GetMakefile().GetDefinition(args.front());
    if (cacheValue && !cmIsNOTFOUND(*cacheValue)) {
      return true;
    }
  }

  std::string result;
  std::string filename = args[1];
  if (filename.find("[HKEY") != std::string::npos) {
    // Check the registry as the target application would view it.
    cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
    cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
    if (status.GetMakefile().PlatformIs64Bit()) {
      view = cmSystemTools::KeyWOW64_64;
      other_view = cmSystemTools::KeyWOW64_32;
    }
    cmSystemTools::ExpandRegistryValues(filename, view);
    if (filename.find("/registry") != std::string::npos) {
      std::string other = args[1];
      cmSystemTools::ExpandRegistryValues(other, other_view);
      if (other.find("/registry") == std::string::npos) {
        filename = other;
      }
    }
  }
  std::string storeArgs;
  std::string programArgs;
  if (args[2] == "DIRECTORY" || args[2] == "PATH") {
    result = cmSystemTools::GetFilenamePath(filename);
  } else if (args[2] == "NAME") {
    result = cmSystemTools::GetFilenameName(filename);
  } else if (args[2] == "PROGRAM") {
    for (unsigned int i = 2; i < args.size(); ++i) {
      if (args[i] == "PROGRAM_ARGS") {
        i++;
        if (i < args.size()) {
          storeArgs = args[i];
        }
      }
    }

    // First assume the path to the program was specified with no
    // arguments and with no quoting or escaping for spaces.
    // Only bother doing this if there is non-whitespace.
    if (!cmTrimWhitespace(filename).empty()) {
      result = cmSystemTools::FindProgram(filename);
    }

    // If that failed then assume a command-line string was given
    // and split the program part from the rest of the arguments.
    if (result.empty()) {
      std::string program;
      if (cmSystemTools::SplitProgramFromArgs(filename, program,
                                              programArgs)) {
        if (cmSystemTools::FileExists(program)) {
          result = program;
        } else {
          result = cmSystemTools::FindProgram(program);
        }
      }
      if (result.empty()) {
        programArgs.clear();
      }
    }
  } else if (args[2] == "EXT") {
    result = cmSystemTools::GetFilenameExtension(filename);
  } else if (args[2] == "NAME_WE") {
    result = cmSystemTools::GetFilenameWithoutExtension(filename);
  } else if (args[2] == "LAST_EXT") {
    result = cmSystemTools::GetFilenameLastExtension(filename);
  } else if (args[2] == "NAME_WLE") {
    result = cmSystemTools::GetFilenameWithoutLastExtension(filename);
  } else if (args[2] == "ABSOLUTE" || args[2] == "REALPATH") {
    // If the path given is relative, evaluate it relative to the
    // current source directory unless the user passes a different
    // base directory.
    std::string baseDir = status.GetMakefile().GetCurrentSourceDirectory();
    for (unsigned int i = 3; i < args.size(); ++i) {
      if (args[i] == "BASE_DIR") {
        ++i;
        if (i < args.size()) {
          baseDir = args[i];
        }
      }
    }
    // Collapse the path to its simplest form.
    result = cmSystemTools::CollapseFullPath(filename, baseDir);
    if (args[2] == "REALPATH") {
      // Resolve symlinks if possible
      result = cmSystemTools::GetRealPath(result);
    }
  } else {
    std::string err = "unknown component " + args[2];
    status.SetError(err);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (args.size() >= 4 && args.back() == "CACHE") {
    if (!programArgs.empty() && !storeArgs.empty()) {
      status.GetMakefile().AddCacheDefinition(
        storeArgs, programArgs, "",
        args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
    }
    status.GetMakefile().AddCacheDefinition(
      args.front(), result, "",
      args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
  } else {
    if (!programArgs.empty() && !storeArgs.empty()) {
      status.GetMakefile().AddDefinition(storeArgs, programArgs);
    }
    status.GetMakefile().AddDefinition(args.front(), result);
  }

  return true;
}